

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReader::TiledFaceBase::~TiledFaceBase(TiledFaceBase *this)

{
  bool bVar1;
  iterator this_00;
  reference ppFVar2;
  __normal_iterator<Ptex::v2_4::PtexReader::FaceData_**,_std::vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>_>
  *in_RDI;
  iterator i;
  FaceData *in_stack_ffffffffffffffd8;
  
  in_RDI->_M_current = (FaceData **)&PTR__TiledFaceBase_00132680;
  this_00 = std::
            vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
            ::begin((vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
                     *)in_stack_ffffffffffffffd8);
  while( true ) {
    std::
    vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
    ::end((vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
           *)in_stack_ffffffffffffffd8);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<Ptex::v2_4::PtexReader::FaceData_**,_std::vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>_>
                               *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<Ptex::v2_4::PtexReader::FaceData_**,_std::vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>_>
              ::operator*((__normal_iterator<Ptex::v2_4::PtexReader::FaceData_**,_std::vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>_>
                           *)&stack0xfffffffffffffff0);
    if (*ppFVar2 != (FaceData *)0x0) {
      ppFVar2 = __gnu_cxx::
                __normal_iterator<Ptex::v2_4::PtexReader::FaceData_**,_std::vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>_>
                ::operator*((__normal_iterator<Ptex::v2_4::PtexReader::FaceData_**,_std::vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>_>
                             *)&stack0xfffffffffffffff0);
      in_stack_ffffffffffffffd8 = *ppFVar2;
      if (in_stack_ffffffffffffffd8 != (FaceData *)0x0) {
        (*(in_stack_ffffffffffffffd8->super_PtexFaceData)._vptr_PtexFaceData[1])();
      }
    }
    __gnu_cxx::
    __normal_iterator<Ptex::v2_4::PtexReader::FaceData_**,_std::vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>_>
    ::operator++((__normal_iterator<Ptex::v2_4::PtexReader::FaceData_**,_std::vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>_>
                  *)&stack0xfffffffffffffff0);
  }
  std::
  vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>::
  ~vector((vector<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
           *)this_00._M_current);
  FaceData::~FaceData((FaceData *)0x110500);
  return;
}

Assistant:

virtual ~TiledFaceBase() {
            for (std::vector<FaceData*>::iterator i = _tiles.begin(); i != _tiles.end(); ++i) {
                if (*i) delete *i;
            }
        }